

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNsPtr xmlTreeEnsureXMLDecl(xmlDocPtr doc)

{
  xmlChar *pxVar1;
  _xmlNode *p_Var2;
  xmlNsPtr ns;
  xmlDocPtr doc_local;
  
  if (doc == (xmlDocPtr)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else if (doc->oldNs == (_xmlNs *)0x0) {
    doc_local = (xmlDocPtr)(*xmlMalloc)(0x30);
    if (doc_local == (xmlDocPtr)0x0) {
      xmlTreeErrMemory("allocating the XML namespace");
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      memset(doc_local,0,0x30);
      doc_local->type = XML_NAMESPACE_DECL;
      pxVar1 = xmlStrdup((xmlChar *)"http://www.w3.org/XML/1998/namespace");
      doc_local->name = (char *)pxVar1;
      p_Var2 = (_xmlNode *)xmlStrdup("xml");
      doc_local->children = p_Var2;
      doc->oldNs = (_xmlNs *)doc_local;
    }
  }
  else {
    doc_local = (xmlDocPtr)doc->oldNs;
  }
  return (xmlNsPtr)doc_local;
}

Assistant:

static xmlNsPtr
xmlTreeEnsureXMLDecl(xmlDocPtr doc)
{
    if (doc == NULL)
	return (NULL);
    if (doc->oldNs != NULL)
	return (doc->oldNs);
    {
	xmlNsPtr ns;
	ns = (xmlNsPtr) xmlMalloc(sizeof(xmlNs));
	if (ns == NULL) {
	    xmlTreeErrMemory(
		"allocating the XML namespace");
	    return (NULL);
	}
	memset(ns, 0, sizeof(xmlNs));
	ns->type = XML_LOCAL_NAMESPACE;
	ns->href = xmlStrdup(XML_XML_NAMESPACE);
	ns->prefix = xmlStrdup((const xmlChar *)"xml");
	doc->oldNs = ns;
	return (ns);
    }
}